

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_impl.hpp
# Opt level: O2

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::insert
          (SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *this,
          BindingMap *svBindings,LeafData *ld)

{
  TermList **ppTVar1;
  long lVar2;
  Node *pNVar3;
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *pSVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  IntermediateNode *pIVar8;
  TermList *pTVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Node **leaf;
  TermList TVar10;
  ulong uVar11;
  undefined4 extraout_var_02;
  Node *pNVar12;
  TermList *pTVar13;
  Term *t;
  Node **inode;
  TermList tt;
  UnresolvedSplitRecord UVar14;
  Binding BVar15;
  UnresolvedSplitRecord obj;
  Top TVar16;
  Stack<Kernel::TermList_*> subterms;
  TermList term;
  undefined1 local_1d0 [8];
  VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_> local_1c8;
  uint boundVar;
  uint boundVar_1;
  uint uStack_1b4;
  Entry *pEStack_1b0;
  Binding *local_1a8;
  SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *local_1a0;
  SelectedSummand local_198;
  SelectedSummand local_168;
  undefined1 local_138 [72];
  SelectedSummand local_f0;
  SelectedSummand local_c0;
  SelectedSummand local_90;
  SelectedSummand local_60;
  undefined4 extraout_var_01;
  
  inode = &this->_root;
  if (this->_root == (Node *)0x0) {
    if (svBindings->_size == 0) {
      pNVar12 = &createLeaf()->super_Node;
      Kernel::SelectedSummand::SelectedSummand(&local_60,&ld->super_SelectedSummand);
      (*((Node *)&pNVar12->_vptr_Node)->_vptr_Node[9])(pNVar12,&local_60);
      *inode = pNVar12;
      return;
    }
    uVar6 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::
            getOneKey(svBindings);
    pIVar8 = createIntermediateNode(uVar6);
    *inode = &pIVar8->super_Node;
  }
  if (svBindings->_size == 0) {
    ensureLeafEfficiency((Leaf **)inode);
    pNVar12 = *inode;
    Kernel::SelectedSummand::SelectedSummand(&local_c0,&ld->super_SelectedSummand);
    Kernel::SelectedSummand::SelectedSummand(&local_90,&local_c0);
    (*pNVar12->_vptr_Node[9])(pNVar12,&local_90);
  }
  else {
    if ((insert(Lib::DHMap<unsigned_int,Kernel::TermList,Lib::IdentityHash,Lib::DefaultHash>&,Inferences::ALASCA::FourierMotzkinConf::Rhs)
         ::unresolvedSplits == '\0') &&
       (iVar7 = __cxa_guard_acquire(&insert(Lib::DHMap<unsigned_int,Kernel::TermList,Lib::IdentityHash,Lib::DefaultHash>&,Inferences::ALASCA::FourierMotzkinConf::Rhs)
                                     ::unresolvedSplits), iVar7 != 0)) {
      insert::unresolvedSplits._size = 0;
      insert::unresolvedSplits._capacity = 0;
      insert::unresolvedSplits._data = (UnresolvedSplitRecord *)0x0;
      insert::unresolvedSplits._data1 = (UnresolvedSplitRecord *)0x0;
      __cxa_atexit(Lib::
                   BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
                   ::~BinaryHeap,&insert::unresolvedSplits,&__dso_handle);
      __cxa_guard_release(&insert(Lib::DHMap<unsigned_int,Kernel::TermList,Lib::IdentityHash,Lib::DefaultHash>&,Inferences::ALASCA::FourierMotzkinConf::Rhs)
                           ::unresolvedSplits);
    }
    insert::unresolvedSplits._0_8_ = insert::unresolvedSplits._0_8_ & 0xffffffff00000000;
    local_1a0 = this;
LAB_002beea9:
    while ((iVar7 = (*(*inode)->_vptr_Node[2])(), (char)iVar7 == '\0' &&
           (iVar7 = (*(*inode)->_vptr_Node[5])(), iVar7 == 1))) {
      pNVar12 = *inode;
      iVar7 = (*pNVar12->_vptr_Node[4])(pNVar12);
      if (iVar7 != 1) break;
      _boundVar_1 = (Entry *)CONCAT44(uStack_1b4,*(undefined4 *)&pNVar12[1]._vptr_Node);
      pNVar3 = (Node *)pNVar12[1]._term._content;
      Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::find
                ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
                 &subterms,&svBindings->_timestamp);
      if (subterms._capacity == 0) {
        TVar10._content = (pNVar3->_term)._content;
        if (((TVar10._content & 3) != 0) || ((*(byte *)(TVar10._content + 0x28) & 8) != 0))
        goto LAB_002bef69;
        bVar5 = false;
        goto LAB_002befa4;
      }
      pTVar9 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::get
                         (svBindings,boundVar_1);
      subterms._capacity = pTVar9->_content;
      TVar16 = Kernel::TermList::top((TermList *)&subterms);
      iVar7 = (*pNVar12->_vptr_Node[10])
                        (pNVar12,TVar16._inner._inner._0_8_,
                         (ulong)(TVar16._inner._inner._8_4_ & 0xff),0);
      if (CONCAT44(extraout_var,iVar7) != 0) {
        bVar5 = true;
        goto LAB_002befa4;
      }
      TVar10._content = (pNVar3->_term)._content;
LAB_002bef69:
      UVar14._4_4_ = 0;
      UVar14.var = *(uint *)&pNVar12[1]._vptr_Node;
      UVar14.original._content = TVar10._content;
      Lib::
      BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
      ::insert(&insert::unresolvedSplits,UVar14);
      (pNVar3->_term)._content = (pNVar12->_term)._content;
      *inode = pNVar3;
      (pNVar12->_term)._content = 2;
      (*pNVar12->_vptr_Node[0xc])(pNVar12);
      (*pNVar12->_vptr_Node[1])(pNVar12);
    }
    bVar5 = false;
LAB_002befa4:
    if ((insert::unresolvedSplits._size != 0) && (!bVar5 && insert::unresolvedSplits._size != 0)) {
      do {
        UVar14 = Lib::
                 BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
                 ::pop(&insert::unresolvedSplits);
        pNVar12 = *inode;
        pIVar8 = createIntermediateNode((TermList)(pNVar12->_term)._content,UVar14.var);
        (pNVar12->_term)._content = UVar14.original._content._content;
        *inode = &pIVar8->super_Node;
        TVar16 = Kernel::TermList::top(&pNVar12->_term);
        iVar7 = (*(pIVar8->super_Node)._vptr_Node[10])
                          (pIVar8,TVar16._inner._inner._0_8_,
                           (ulong)(TVar16._inner._inner._8_4_ & 0xff),1);
        *(Node **)CONCAT44(extraout_var_00,iVar7) = pNVar12;
      } while (insert::unresolvedSplits._size != 0);
    }
    pNVar12 = *inode;
    boundVar = *(uint *)&pNVar12[1]._vptr_Node;
    pTVar9 = Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::get
                       (svBindings,boundVar);
    term._content = pTVar9->_content;
    Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::remove
              ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
               local_138,(char *)svBindings);
    pTVar9 = &term;
    TVar16 = Kernel::TermList::top(pTVar9);
    iVar7 = (*pNVar12->_vptr_Node[10])
                      (pNVar12,TVar16._inner._inner._0_8_,(ulong)(TVar16._inner._inner._8_4_ & 0xff)
                       ,1);
    leaf = (Node **)CONCAT44(extraout_var_01,iVar7);
    if (*leaf == (Node *)0x0) {
      _boundVar_1 = (Entry *)0x0;
      pEStack_1b0 = (Entry *)0x0;
      local_1a8 = (Binding *)0x0;
      Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::items
                ((DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash> *)
                 local_1d0);
      Lib::iterTraits<Lib::VirtualIterator<std::pair<unsigned_int_const&,Kernel::TermList_const&>>>
                ((Lib *)&local_1c8,
                 (VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_> *)
                 local_1d0);
      Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>::
      ~VirtualIterator((VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>
                        *)local_1d0);
      Lib::
      IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
      ::StlIter::StlIter((StlIter *)&subterms,
                         (IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
                          *)&local_1c8);
      while ((char)subterms._stack != '\0') {
        BVar15._4_4_ = 0;
        BVar15.var = *(uint *)subterms._cursor;
        BVar15.term._content = (uint64_t)*subterms._end;
        Lib::
        BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
        ::insert((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
                  *)&boundVar_1,BVar15);
        Lib::
        IterTraits<Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>_>
        ::StlIter::operator++((StlIter *)&subterms);
      }
      Lib::VirtualIterator<std::pair<const_unsigned_int_&,_const_Kernel::TermList_&>_>::
      ~VirtualIterator(&local_1c8);
      while (boundVar_1 != 0) {
        BVar15 = Lib::
                 BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
                 ::pop((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
                        *)&boundVar_1);
        pIVar8 = createIntermediateNode(term,BVar15.var);
        *leaf = &pIVar8->super_Node;
        term._content = BVar15.term._content._content;
        TVar16 = Kernel::TermList::top(&term);
        iVar7 = (*(pIVar8->super_Node)._vptr_Node[10])
                          (pIVar8,TVar16._inner._inner._0_8_,
                           (ulong)(TVar16._inner._inner._8_4_ & 0xff),1);
        leaf = (Node **)CONCAT44(extraout_var_02,iVar7);
      }
      pNVar12 = &createLeaf(term)->super_Node;
      *leaf = pNVar12;
      Kernel::SelectedSummand::SelectedSummand(&local_198,&ld->super_SelectedSummand);
      Kernel::SelectedSummand::SelectedSummand(&local_168,&local_198);
      (*((Node *)&pNVar12->_vptr_Node)->_vptr_Node[9])(pNVar12,&local_168);
      ensureIntermediateNodeEfficiency((IntermediateNode **)inode);
      Lib::
      BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
      ::~BinaryHeap((BinaryHeap<Indexing::SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs>::Binding,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
                     *)&boundVar_1);
      return;
    }
    pTVar13 = &(*leaf)->_term;
    subterms._capacity = 0x40;
    subterms._stack = (TermList **)Lib::alloc(0x200);
    pSVar4 = local_1a0;
    subterms._end = subterms._stack + subterms._capacity;
    subterms._cursor = subterms._stack;
LAB_002bf0a5:
    TVar10._content = pTVar9->_content;
    tt._content = TVar10._content;
    if (TVar10._content != pTVar13->_content) {
      bVar5 = Kernel::TermList::sameTop((TermList)pTVar13->_content,TVar10);
      TVar10._content = pTVar13->_content;
      tt._content = pTVar9->_content;
      if (bVar5) {
        if ((((Term *)TVar10._content)->_args[0]._content & 8) != 0) {
          TVar10._content = (uint64_t)Kernel::Term::cloneNonShared(TVar10._content);
          pTVar13->_content = TVar10._content;
        }
        uVar11 = (ulong)(*(uint *)&((Term *)TVar10._content)->field_0xc & 0xfffffff);
        pTVar13 = ((Term *)TVar10._content)->_args + uVar11;
        lVar2 = tt._content + (ulong)(*(uint *)(tt._content + 0xc) & 0xfffffff) * 8;
        pTVar9 = (TermList *)(lVar2 + 0x28);
        if ((((Term *)TVar10._content)->_args[uVar11 - 1]._content & 3) != 2) {
          Lib::Stack<Kernel::TermList_*>::push
                    (&subterms,((Term *)TVar10._content)->_args + (uVar11 - 1));
          Lib::Stack<Kernel::TermList_*>::push(&subterms,(TermList *)(lVar2 + 0x20));
        }
        goto LAB_002bf0a5;
      }
    }
    bVar5 = Kernel::TermList::sameTop(TVar10,tt);
    if (!bVar5) {
      TVar10._content = pTVar13->_content;
      if ((~(uint)TVar10._content & 3) == 0) {
        uVar6 = (uint)(TVar10._content >> 2);
      }
      else {
        uVar6 = pSVar4->_nextVar;
        obj._4_4_ = 0;
        obj.var = uVar6;
        pSVar4->_nextVar = uVar6 + 1;
        obj.original._content = TVar10._content;
        Lib::
        BinaryHeap<Indexing::UnresolvedSplitRecord,_Indexing::BindingComparator<Inferences::ALASCA::FourierMotzkinConf::Rhs>_>
        ::insert(&insert::unresolvedSplits,obj);
        pTVar13->_content = (ulong)(uVar6 * 4 + 3);
      }
      Lib::DHMap<unsigned_int,_Kernel::TermList,_Lib::IdentityHash,_Lib::DefaultHash>::set
                (svBindings,uVar6,(TermList)pTVar9->_content);
    }
    if (subterms._cursor != subterms._stack) {
      pTVar9 = subterms._cursor[-1];
      ppTVar1 = subterms._cursor + -2;
      pTVar13 = subterms._cursor[-2];
      subterms._cursor = ppTVar1;
      if ((((anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar13 + -1))->_vars & 3) != 2) {
        Lib::Stack<Kernel::TermList_*>::push
                  (&subterms,&((anon_union_8_2_f154dc0f_for_Term_10 *)(pTVar13 + -1))->_sort);
        Lib::Stack<Kernel::TermList_*>::push(&subterms,pTVar9 + -1);
      }
      goto LAB_002bf0a5;
    }
    if (svBindings->_size != 0) {
      Lib::Stack<Kernel::TermList_*>::~Stack(&subterms);
      inode = leaf;
      goto LAB_002beea9;
    }
    ensureLeafEfficiency((Leaf **)leaf);
    pNVar12 = *leaf;
    Kernel::SelectedSummand::SelectedSummand
              ((SelectedSummand *)(local_138 + 0x18),&ld->super_SelectedSummand);
    Kernel::SelectedSummand::SelectedSummand(&local_f0,(SelectedSummand *)(local_138 + 0x18));
    (*((Node *)&pNVar12->_vptr_Node)->_vptr_Node[9])(pNVar12,&local_f0);
    Lib::Stack<Kernel::TermList_*>::~Stack(&subterms);
  }
  return;
}

Assistant:

void SubstitutionTree<LeafData_>::insert(BindingMap& svBindings, LeafData ld)
{
  ASS_EQ(_iterCnt,0);
  auto pnode = &_root;
  DEBUG_INSERT(0, "insert: ", svBindings, " into ", *this)

  if(*pnode == 0) {
    if (svBindings.isEmpty()) {
      auto leaf = createLeaf();
      leaf->insert(std::move(ld));
      *pnode = leaf;
      DEBUG_INSERT(0, "out: ", *this);
      return;
    } else {
      *pnode=createIntermediateNode(svBindings.getOneKey());
    }
  }
  if(svBindings.isEmpty()) {
    ASS((*pnode)->isLeaf());
    ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));
    static_cast<Leaf*>(*pnode)->insert(ld);
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }

  typedef BinaryHeap<UnresolvedSplitRecord, BindingComparator<LeafData_>> SplitRecordHeap;
  static SplitRecordHeap unresolvedSplits;
  unresolvedSplits.reset();

  ASS((*pnode));
  ASS(!(*pnode)->isLeaf());

start:

#if REORDERING
  ASS(!(*pnode)->isLeaf() || !unresolvedSplits.isEmpty());
  bool canPostponeSplits=false;
  if((*pnode)->isLeaf() || (*pnode)->algorithm()!=UNSORTED_LIST) {
    canPostponeSplits=false;
  } else {
    UArrIntermediateNode* inode = static_cast<UArrIntermediateNode*>(*pnode);
    canPostponeSplits = inode->size()==1;
    if(canPostponeSplits) {
      unsigned boundVar=inode->childVar;
      Node* child=inode->_nodes[0];
      bool removeProblematicNode=false;
      if(svBindings.find(boundVar)) {
	TermList term=svBindings.get(boundVar);
	bool wouldDescendIntoChild = inode->childByTop(term.top(),false)!=0;
	ASS_EQ(wouldDescendIntoChild, TermList::sameTop(term, child->term()));
	if(!wouldDescendIntoChild) {
	  //if we'd have to perform all postponed splitting due to
	  //node with a single child, we rather remove that node
	  //from the tree and deal with the binding, it represented,
	  //later.
	  removeProblematicNode=true;
	}
      } else if(!child->term().isTerm() || child->term().term()->shared()) {
	//We can remove nodes binding to special variables undefined in our branch
	//of the tree, as long as we're sure, that during split resolving we put these
	//binding nodes below nodes that define spec. variables they bind.
	removeProblematicNode=true;
      } else {
	canPostponeSplits = false;
      }
      if(removeProblematicNode) {
	unresolvedSplits.insert(UnresolvedSplitRecord(inode->childVar, child->term()));
	child->setTerm(inode->term());
	*pnode=child;
	inode->makeEmpty();
	delete inode;
	goto start;
      }
    }
  }
  canPostponeSplits|=unresolvedSplits.isEmpty();
  if(!canPostponeSplits) {

    while(!unresolvedSplits.isEmpty()) {
      UnresolvedSplitRecord urr=unresolvedSplits.pop();

      Node* node=*pnode;
      IntermediateNode* newNode = createIntermediateNode(node->term(), urr.var);
      node->setTerm(urr.original);

      *pnode=newNode;

      Node** nodePosition=newNode->childByTop(node->top(), true);
      ASS(!*nodePosition);
      *nodePosition=node;
    }
  }
#endif
  ASS(!(*pnode)->isLeaf());

  IntermediateNode* inode = static_cast<IntermediateNode*>(*pnode);
  ASS(inode);

  unsigned boundVar=inode->childVar;
  TermList term=svBindings.get(boundVar);
  svBindings.remove(boundVar);

  //Into pparent we store the node, we might be inserting into.
  //So in the case we do insert, we might check whether this node
  //needs expansion.
  Node** pparent=pnode;
  pnode=inode->childByTop(term.top(),true);

  if (*pnode == 0) {
    BinaryHeap<Binding, BindingComparator<LeafData_>> remainingBindings;
    for (auto [var, term] : iterTraits(svBindings.items())) {
      remainingBindings.insert(Binding(var, term));
    }
    while (!remainingBindings.isEmpty()) {
      Binding b=remainingBindings.pop();
      IntermediateNode* inode = createIntermediateNode(term, b.var);
      term=b.term;

      *pnode = inode;
      pnode = inode->childByTop(term.top(),true);
    }
    Leaf* lnode=createLeaf(term);
    *pnode=lnode;
    lnode->insert(ld);

    ensureIntermediateNodeEfficiency(reinterpret_cast<IntermediateNode**>(pparent));
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }


  TermList* tt = &term;
  TermList* ss = &(*pnode)->term();

  ASS(TermList::sameTop(*ss, *tt));


  // ss is the term in node, tt is the term to be inserted
  // ss and tt have the same top symbols but are not equal
  // create the common subterm of ss,tt and an alternative node
  Stack<TermList*> subterms(64);
  for (;;) {
    if (*tt!=*ss && TermList::sameTop(*ss,*tt)) {
      // ss and tt have the same tops and are different, so must be non-variables
      ASS(! ss->isVar());
      ASS(! tt->isVar());

      Term* s = ss->term();
      Term* t = tt->term();

      ASS(s->arity() > 0);
      ASS(s->functor() == t->functor());

      if (s->shared()) {
        // create a shallow copy of s
        s = Term::cloneNonShared(s);
        ss->setTerm(s);
      }

      ss = s->args();
      tt = t->args();
      if (ss->next()->isEmpty()) {
        continue;
      }
      subterms.push(ss->next());
      subterms.push(tt->next());
    } else {
      if (! TermList::sameTop(*ss,*tt)) {
        unsigned x;
        if(!ss->isSpecialVar()) {
          x = _nextVar++;
        #if REORDERING
          unresolvedSplits.insert(UnresolvedSplitRecord(x,*ss));
          ss->makeSpecialVar(x);
        #else
          Node::split(pnode,ss,x);
        #endif
        } else {
          x=ss->var();
        }
        svBindings.set(x,*tt);
      }

      if (subterms.isEmpty()) {
        break;
      }
      tt = subterms.pop();
      ss = subterms.pop();
      if (! ss->next()->isEmpty()) {
        subterms.push(ss->next());
        subterms.push(tt->next());
      }
    }
  }

  if (svBindings.isEmpty()) {
    ASS((*pnode)->isLeaf());
    ensureLeafEfficiency(reinterpret_cast<Leaf**>(pnode));
    Leaf* leaf = static_cast<Leaf*>(*pnode);
    leaf->insert(ld);
    DEBUG_INSERT(0, "out: ", *this);
    return;
  }

  goto start;
}